

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O2

void internal_zip_reconstruct_bytes(uint8_t *out,uint8_t *source,uint64_t count)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint8_t uVar31;
  ulong uVar32;
  uint8_t *puVar33;
  uint8_t *puVar34;
  uint8_t *puVar35;
  long lVar36;
  long lVar37;
  
  for (puVar34 = source + 1; puVar34 < source + count; puVar34 = puVar34 + 1) {
    *puVar34 = *puVar34 + puVar34[-1] + 0x80;
  }
  uVar32 = count + 1 >> 1;
  lVar37 = 0;
  for (lVar36 = 0; (count >> 1 & 0xfffffffffffffff0) + lVar36 != 0; lVar36 = lVar36 + -0x10) {
    puVar34 = source + lVar37 * 2;
    uVar1 = puVar34[1];
    uVar2 = puVar34[2];
    uVar3 = puVar34[3];
    uVar4 = puVar34[4];
    uVar5 = puVar34[5];
    uVar6 = puVar34[6];
    uVar7 = puVar34[7];
    uVar8 = puVar34[8];
    uVar9 = puVar34[9];
    uVar10 = puVar34[10];
    uVar11 = puVar34[0xb];
    uVar12 = puVar34[0xc];
    uVar13 = puVar34[0xd];
    uVar14 = puVar34[0xe];
    uVar15 = puVar34[0xf];
    puVar35 = source + lVar37 * 2 + uVar32;
    uVar16 = *puVar35;
    uVar17 = puVar35[1];
    uVar18 = puVar35[2];
    uVar19 = puVar35[3];
    uVar20 = puVar35[4];
    uVar21 = puVar35[5];
    uVar22 = puVar35[6];
    uVar23 = puVar35[7];
    uVar24 = puVar35[8];
    uVar25 = puVar35[9];
    uVar26 = puVar35[10];
    uVar27 = puVar35[0xb];
    uVar28 = puVar35[0xc];
    uVar29 = puVar35[0xd];
    uVar30 = puVar35[0xe];
    uVar31 = puVar35[0xf];
    *out = *puVar34;
    out[1] = uVar16;
    out[2] = uVar1;
    out[3] = uVar17;
    out[4] = uVar2;
    out[5] = uVar18;
    out[6] = uVar3;
    out[7] = uVar19;
    out[8] = uVar4;
    out[9] = uVar20;
    out[10] = uVar5;
    out[0xb] = uVar21;
    out[0xc] = uVar6;
    out[0xd] = uVar22;
    out[0xe] = uVar7;
    out[0xf] = uVar23;
    out[0x10] = uVar8;
    out[0x11] = uVar24;
    out[0x12] = uVar9;
    out[0x13] = uVar25;
    out[0x14] = uVar10;
    out[0x15] = uVar26;
    out[0x16] = uVar11;
    out[0x17] = uVar27;
    out[0x18] = uVar12;
    out[0x19] = uVar28;
    out[0x1a] = uVar13;
    out[0x1b] = uVar29;
    out[0x1c] = uVar14;
    out[0x1d] = uVar30;
    out[0x1e] = uVar15;
    out[0x1f] = uVar31;
    out = out + 0x20;
    lVar37 = lVar37 + 8;
  }
  puVar34 = source + (uVar32 - lVar36);
  puVar35 = source + -lVar36;
  for (lVar37 = 0; uVar32 = (count & 0xffffffffffffffe0) + lVar37, uVar32 < count;
      lVar37 = lVar37 + 1) {
    uVar32 = (ulong)((uint)uVar32 & 1);
    puVar33 = puVar34;
    if (uVar32 == 0) {
      puVar33 = puVar35;
    }
    out[lVar37] = *puVar33;
    puVar34 = puVar34 + uVar32;
    puVar35 = puVar35 + (uVar32 ^ 1);
  }
  return;
}

Assistant:

static void
reconstruct (uint8_t* buf, uint64_t sz)
{
    uint8_t* t    = buf + 1;
    uint8_t* stop = buf + sz;
    while (t < stop)
    {
        int d = (int) (t[-1]) + (int) (t[0]) - 128;
        t[0]  = (uint8_t) d;
        ++t;
    }
}